

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::evaluateCollocationConstraintJacobian
          (ForwardEuler *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *stateJacobianValues,
          vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
          *controlJacobianValues)

{
  DynamicalSystem *this_00;
  element_type *peVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  ostream *poVar6;
  string *psVar7;
  char *pcVar8;
  char *pcVar9;
  pointer pcVar10;
  ulong uVar11;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_218;
  MatrixDynSize *local_1f8;
  size_t local_1f0;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_1e8;
  ostringstream errorMsg;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  this_00 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
            super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00 == (DynamicalSystem *)0x0) {
    psVar7 = IntegratorInfo::name_abi_cxx11_
                       (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar10 = (psVar7->_M_dataplus)._M_p;
    pcVar9 = "evaluateCollocationConstraint";
    pcVar8 = "Dynamical system not set.";
LAB_001b0d5e:
    iDynTree::reportError(pcVar10,pcVar9,pcVar8);
  }
  else {
    if ((long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if ((long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x40) {
        sVar3 = DynamicalSystem::stateSpaceSize(this_00);
        local_1f0 = DynamicalSystem::controlSpaceSize
                              ((this->super_FixedStepIntegrator).super_Integrator.
                               m_dynamicalSystem_ptr.
                               super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
        if ((long)(stateJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(stateJacobianValues->
                  super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                  )._M_impl.super__Vector_impl_data._M_start != 0x50) {
          std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
                    (stateJacobianValues,2);
        }
        uVar4 = iDynTree::MatrixDynSize::rows();
        uVar11 = sVar3 & 0xffffffff;
        if ((uVar4 != uVar11) || (uVar5 = iDynTree::MatrixDynSize::cols(), uVar5 != uVar4)) {
          iDynTree::MatrixDynSize::resize
                    ((ulong)(stateJacobianValues->
                            super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                            )._M_impl.super__Vector_impl_data._M_start,uVar11);
        }
        peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                 super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar2 = (*peVar1->_vptr_DynamicalSystem[3])
                          (peVar1,(controlInputs->
                                  super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
        if ((char)iVar2 == '\0') {
          psVar7 = IntegratorInfo::name_abi_cxx11_
                             (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar10 = (psVar7->_M_dataplus)._M_p;
          pcVar9 = "evaluateCollocationConstraintJacobian";
          pcVar8 = "Error while setting the control input.";
        }
        else {
          peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          iVar2 = (*peVar1->_vptr_DynamicalSystem[9])
                            (SUB84(time,0),peVar1,
                             (collocationPoints->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start,&this->m_stateJacBuffer);
          if ((char)iVar2 == '\0') {
            psVar7 = IntegratorInfo::name_abi_cxx11_
                               (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar10 = (psVar7->_M_dataplus)._M_p;
            pcVar9 = "evaluateCollocationConstraintJacobian";
            pcVar8 = "Error while evaluating the dynamical system jacobian.";
          }
          else {
            local_1f8 = &this->m_identity;
            toEigen(&local_218,local_1f8);
            toEigen(&local_1e8,&this->m_stateJacBuffer);
            _errorMsg = local_218.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
            toEigen(&local_50,
                    (stateJacobianValues->
                    super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                    )._M_impl.super__Vector_impl_data._M_start);
            Eigen::internal::
            call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>const>>
                      (&local_50,
                       (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                        *)&errorMsg);
            uVar4 = iDynTree::MatrixDynSize::rows();
            if ((uVar4 != uVar11) || (uVar4 = iDynTree::MatrixDynSize::cols(), uVar4 != uVar11)) {
              iDynTree::MatrixDynSize::resize
                        ((ulong)((stateJacobianValues->
                                 super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x28),uVar11);
            }
            toEigen(&local_218,local_1f8);
            _errorMsg = local_218.
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data;
            toEigen(&local_1e8,
                    (stateJacobianValues->
                    super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                    )._M_impl.super__Vector_impl_data._M_start + 0x28);
            Eigen::internal::
            call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>>
                      (&local_1e8,
                       (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)&errorMsg);
            if ((long)(controlJacobianValues->
                      super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(controlJacobianValues->
                      super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                      )._M_impl.super__Vector_impl_data._M_start != 0x50) {
              std::vector<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>::resize
                        (controlJacobianValues,2);
            }
            uVar4 = iDynTree::MatrixDynSize::rows();
            sVar3 = local_1f0;
            if ((uVar4 != uVar11) ||
               (uVar4 = iDynTree::MatrixDynSize::cols(), uVar4 != (sVar3 & 0xffffffff))) {
              iDynTree::MatrixDynSize::resize
                        ((ulong)(controlJacobianValues->
                                super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                                )._M_impl.super__Vector_impl_data._M_start,uVar11);
            }
            peVar1 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar2 = (*peVar1->_vptr_DynamicalSystem[10])
                              (SUB84(time,0),peVar1,
                               (collocationPoints->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start,&this->m_controlJacBuffer)
            ;
            if ((char)iVar2 != '\0') {
              toEigen(&local_218,&this->m_controlJacBuffer);
              toEigen(&local_1e8,
                      (controlJacobianValues->
                      super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                      )._M_impl.super__Vector_impl_data._M_start);
              Eigen::internal::
              call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const>>
                        (&local_1e8,
                         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                          *)&errorMsg);
              uVar4 = iDynTree::MatrixDynSize::rows();
              if ((uVar4 != uVar11) ||
                 (uVar4 = iDynTree::MatrixDynSize::cols(), uVar4 != (sVar3 & 0xffffffff))) {
                iDynTree::MatrixDynSize::resize
                          ((ulong)((controlJacobianValues->
                                   super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 0x28),uVar11);
              }
              iDynTree::MatrixDynSize::operator=
                        ((controlJacobianValues->
                         super__Vector_base<iDynTree::MatrixDynSize,_std::allocator<iDynTree::MatrixDynSize>_>
                         )._M_impl.super__Vector_impl_data._M_start + 0x28,&this->m_zeroNxNuBuffer);
              return true;
            }
            psVar7 = IntegratorInfo::name_abi_cxx11_
                               (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar10 = (psVar7->_M_dataplus)._M_p;
            pcVar9 = "evaluateCollocationConstraintJacobian";
            pcVar8 = "Error while evaluating the dynamical system control jacobian.";
          }
        }
        goto LAB_001b0d5e;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMsg);
      std::operator<<((ostream *)&errorMsg,
                      "The size of the matrix containing the control inputs does not match the expected one. Input = "
                     );
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&errorMsg);
      std::operator<<(poVar6,", Expected = 2.");
      psVar7 = IntegratorInfo::name_abi_cxx11_
                         (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar8 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar8,"evaluateCollocationConstraintJacobian",
                 (char *)local_218.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMsg);
      std::operator<<((ostream *)&errorMsg,
                      "The size of the matrix containing the collocation point does not match the expected one. Input = "
                     );
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&errorMsg);
      std::operator<<(poVar6,", Expected = 2.");
      psVar7 = IntegratorInfo::name_abi_cxx11_
                         (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar8 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar8,"evaluateCollocationConstraintJacobian",
                 (char *)local_218.
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         .
                         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_data);
    }
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMsg);
  }
  return false;
}

Assistant:

bool ForwardEuler::evaluateCollocationConstraintJacobian(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                     const std::vector<VectorDynSize> &controlInputs, double dT,
                                                                     std::vector<MatrixDynSize> &stateJacobianValues,
                                                                     std::vector<MatrixDynSize> &controlJacobianValues)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraint", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", errorMsg.str().c_str());
                    return false;
                }

                unsigned int nx = static_cast<unsigned int>(m_dynamicalSystem_ptr->stateSpaceSize());
                unsigned int nu = static_cast<unsigned int>(m_dynamicalSystem_ptr->controlSpaceSize());

                if (stateJacobianValues.size() != 2) {
                    stateJacobianValues.resize(2);
                }

                if ((stateJacobianValues[0].rows() != nx) || (stateJacobianValues[0].cols() != nx)) {
                    stateJacobianValues[0].resize(nx,nx);
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsStateFirstDerivative(collocationPoints[0], time, m_stateJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system jacobian.");
                    return false;
                }

                toEigen(stateJacobianValues[0]) = toEigen(m_identity) + dT*toEigen(m_stateJacBuffer);

                if ((stateJacobianValues[1].rows() != nx) || (stateJacobianValues[1].cols() != nx)) {
                    stateJacobianValues[1].resize(nx,nx);
                }

                toEigen(stateJacobianValues[1]) = -toEigen(m_identity);

                //Control Jacobians

                if (controlJacobianValues.size() != 2) {
                    controlJacobianValues.resize(2);
                }

                if ((controlJacobianValues[0].rows() != nx) || (controlJacobianValues[0].cols() != nu)) {
                    controlJacobianValues[0].resize(nx,nu);
                }

                if (!(m_dynamicalSystem_ptr->dynamicsControlFirstDerivative(collocationPoints[0], time, m_controlJacBuffer))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintJacobian",
                                "Error while evaluating the dynamical system control jacobian.");
                    return false;
                }

                toEigen(controlJacobianValues[0]) = dT*toEigen(m_controlJacBuffer);

                if ((controlJacobianValues[1].rows() != nx) || (controlJacobianValues[1].cols() != nu)) {
                    controlJacobianValues[1].resize(nx,nu);
                }

                controlJacobianValues[1] = m_zeroNxNuBuffer;

                return true;
            }